

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall
CLI::Option::get_type_name_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string vtype;
  Validator *Validator;
  const_iterator __end3;
  const_iterator __begin3;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range3;
  Option *this_local;
  string *full_type_name;
  
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator()(__return_storage_ptr__,&this->type_name_);
  bVar1 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::empty(&this->validators_);
  if (!bVar1) {
    __end3 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin(&this->validators_)
    ;
    Validator = (Validator *)
                std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end
                          (&this->validators_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                                       *)&Validator), bVar1) {
      vtype.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
           ::operator*(&__end3);
      CLI::Validator::get_description_abi_cxx11_
                ((string *)local_60,(Validator *)vtype.field_2._8_8_);
      uVar2 = ::std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ::std::operator+(&local_90,":",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      ::std::__cxx11::string::~string((string *)local_60);
      __gnu_cxx::
      __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
      ::operator++(&__end3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_type_name() const {
        std::string full_type_name = type_name_();
        if(!validators_.empty()) {
            for(auto &Validator : validators_) {
                std::string vtype = Validator.get_description();
                if(!vtype.empty()) {
                    full_type_name += ":" + vtype;
                }
            }
        }
        return full_type_name;
    }